

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O2

void __thiscall
TPZMHMixedMeshControl::HybridizeSkeleton
          (TPZMHMixedMeshControl *this,int skeletonmatid,int pressurematid)

{
  _Rb_tree_header *p_Var1;
  TPZGeoMesh *pTVar2;
  int64_t iVar3;
  int iVar4;
  int iVar5;
  TPZGeoEl *pTVar6;
  TPZInterpolatedElement *object;
  _Rb_tree_node_base *p_Var7;
  TPZCompEl *pTVar8;
  TPZCompEl *pTVar9;
  long lVar10;
  _Base_ptr p_Var11;
  int64_t iVar12;
  _Self __tmp;
  TPZGeoElBC pressuregel;
  TPZGeoElBC skeleton2;
  TPZGeoElSide gelside;
  TPZStack<TPZInterpolatedElement_*,_10> fluxorig;
  TPZStack<TPZInterpolatedElement_*,_10> pressure;
  TPZStack<TPZInterpolatedElement_*,_10> fluxsecond;
  
  TPZGeoMesh::ResetReference(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer);
  fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>.
  fStore = fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.fExtAlloc;
  fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>.
  fNElements = 0;
  fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>.
  fNAlloc = 0;
  fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01816df8;
  fluxsecond.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>
  .fStore = fluxsecond.super_TPZManVector<TPZInterpolatedElement_*,_10>.fExtAlloc;
  fluxsecond.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>
  .fNElements = 0;
  fluxsecond.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>
  .fNAlloc = 0;
  fluxsecond.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>
  ._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01816df8;
  pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>.
  fStore = pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>.fExtAlloc;
  pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>.
  fNElements = 0;
  pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>.
  fNAlloc = 0;
  pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>.super_TPZVec<TPZInterpolatedElement_*>.
  _vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01816df8;
  TPZCompMesh::LoadReferences(((this->fFluxMesh).fRef)->fPointer);
  p_Var1 = &(this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header;
  for (p_Var7 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header.
                _M_header._M_left; pTVar2 = ((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer,
      (_Rb_tree_header *)p_Var7 != p_Var1;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    pTVar6 = TPZGeoMesh::Element(pTVar2,*(int64_t *)(p_Var7 + 1));
    if ((*(_Base_ptr *)(p_Var7 + 1) != p_Var7[1]._M_left) && (pTVar6->fMatId == skeletonmatid)) {
      (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
      if (pTVar6->fReference == (TPZCompEl *)0x0) {
        object = (TPZInterpolatedElement *)0x0;
      }
      else {
        object = (TPZInterpolatedElement *)
                 __dynamic_cast(pTVar6->fReference,&TPZCompEl::typeinfo,
                                &TPZInterpolatedElement::typeinfo,0);
      }
      TPZStack<TPZInterpolatedElement_*,_10>::Push(&fluxorig,object);
    }
  }
  TPZGeoMesh::ResetReference(pTVar2);
  ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->fDefaultOrder =
       (this->super_TPZMHMeshControl).fpOrderSkeleton;
  for (p_Var11 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header.
                 _M_header._M_left; (_Rb_tree_header *)p_Var11 != p_Var1;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
    pTVar6 = TPZGeoMesh::Element(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer,
                                 *(int64_t *)(p_Var11 + 1));
    if ((*(_Base_ptr *)(p_Var11 + 1) != p_Var11[1]._M_left) && (pTVar6->fMatId == skeletonmatid)) {
      iVar4 = (**(code **)(*(long *)pTVar6 + 0xf0))(pTVar6);
      gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
      gelside.fSide = iVar4 + -1;
      gelside.fGeoEl = pTVar6;
      TPZGeoElBC::TPZGeoElBC
                (&skeleton2,&gelside,(this->super_TPZMHMeshControl).fSecondSkeletonMatId);
      TPZCompMesh::SetAllCreateFunctionsHDiv(((this->fFluxMesh).fRef)->fPointer);
      pTVar8 = TPZCompMesh::CreateCompEl
                         (((this->fFluxMesh).fRef)->fPointer,skeleton2.fCreatedElement);
      if (pTVar8 == (TPZCompEl *)0x0) {
        pTVar8 = (TPZCompEl *)0x0;
      }
      else {
        pTVar8 = (TPZCompEl *)
                 __dynamic_cast(pTVar8,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
      }
      TPZMHMeshControl::SetSubdomain(&this->super_TPZMHMeshControl,pTVar8,-1);
      (**(code **)(*(long *)pTVar8 + 0x2f8))(pTVar8,iVar4 + -1,1);
      (skeleton2.fCreatedElement)->fReference = (TPZCompEl *)0x0;
      TPZGeoElBC::TPZGeoElBC(&pressuregel,&gelside,pressurematid);
      TPZCreateApproximationSpace::SetAllCreateFunctionsContinuous
                (&((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->fCreate);
      pTVar9 = TPZCompMesh::CreateCompEl
                         (((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer,
                          pressuregel.fCreatedElement);
      if (pTVar9 == (TPZCompEl *)0x0) {
        pTVar9 = (TPZCompEl *)0x0;
      }
      else {
        pTVar9 = (TPZCompEl *)
                 __dynamic_cast(pTVar9,&TPZCompEl::typeinfo,&TPZInterpolatedElement::typeinfo,0);
      }
      TPZMHMeshControl::SetSubdomain(&this->super_TPZMHMeshControl,pTVar9,-1);
      iVar5 = (**(code **)(*(long *)pTVar9 + 0x90))(pTVar9);
      iVar4 = 0;
      if (iVar5 < 1) {
        iVar5 = 0;
        iVar4 = 0;
      }
      for (; iVar5 != iVar4; iVar4 = iVar4 + 1) {
        lVar10 = (**(code **)(*(long *)pTVar9 + 0xa8))(pTVar9,iVar4);
        *(undefined1 *)(lVar10 + 0x16) = 3;
      }
      (pressuregel.fCreatedElement)->fReference = (TPZCompEl *)0x0;
      TPZStack<TPZInterpolatedElement_*,_10>::Push(&fluxsecond,(TPZInterpolatedElement *)pTVar8);
      TPZStack<TPZInterpolatedElement_*,_10>::Push(&pressure,(TPZInterpolatedElement *)pTVar9);
    }
  }
  TPZCompMesh::LoadReferences(((this->fFluxMesh).fRef)->fPointer);
  p_Var11 = (this->super_TPZMHMeshControl).fInterfaces._M_t._M_impl.super__Rb_tree_header._M_header.
            _M_left;
  while( true ) {
    pTVar2 = ((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer;
    if ((_Rb_tree_header *)p_Var11 == p_Var1) {
      TPZGeoMesh::ResetReference(pTVar2);
      lVar10 = 0;
      iVar12 = fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.
               super_TPZVec<TPZInterpolatedElement_*>.fNElements;
      if (fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.
          super_TPZVec<TPZInterpolatedElement_*>.fNElements < 1) {
        iVar12 = lVar10;
      }
      for (; iVar12 != lVar10; lVar10 = lVar10 + 1) {
        pTVar6 = TPZCompEl::Reference
                           ((TPZCompEl *)
                            fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.
                            super_TPZVec<TPZInterpolatedElement_*>.fStore[lVar10]);
        iVar3 = pTVar6->fIndex;
        pTVar6 = TPZCompEl::Reference
                           ((TPZCompEl *)
                            fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.
                            super_TPZVec<TPZInterpolatedElement_*>.fStore[lVar10]);
        iVar4 = pTVar6->fMatId;
        pTVar6 = TPZCompEl::Reference
                           ((TPZCompEl *)
                            pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>.
                            super_TPZVec<TPZInterpolatedElement_*>.fStore[lVar10]);
        iVar5 = pTVar6->fMatId;
        pTVar6 = TPZCompEl::Reference
                           ((TPZCompEl *)
                            pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>.
                            super_TPZVec<TPZInterpolatedElement_*>.fStore[lVar10]);
        pTVar8 = (TPZCompEl *)
                 fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.
                 super_TPZVec<TPZInterpolatedElement_*>.fStore[lVar10];
        pTVar8->fReferenceIndex = pTVar6->fIndex;
        (pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>.
         super_TPZVec<TPZInterpolatedElement_*>.fStore[lVar10]->super_TPZInterpolationSpace).
        super_TPZCompEl.fReferenceIndex = iVar3;
        pTVar6 = TPZCompEl::Reference(pTVar8);
        SetAllMatid(pTVar6,iVar4);
        pTVar6 = TPZCompEl::Reference
                           ((TPZCompEl *)
                            pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>.
                            super_TPZVec<TPZInterpolatedElement_*>.fStore[lVar10]);
        SetAllMatid(pTVar6,iVar5);
      }
      (**(code **)(*(long *)((this->fFluxMesh).fRef)->fPointer + 0x60))();
      (**(code **)(*(long *)((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer + 0x60
                  ))();
      TPZManVector<TPZInterpolatedElement_*,_10>::~TPZManVector
                (&pressure.super_TPZManVector<TPZInterpolatedElement_*,_10>);
      TPZManVector<TPZInterpolatedElement_*,_10>::~TPZManVector
                (&fluxsecond.super_TPZManVector<TPZInterpolatedElement_*,_10>);
      TPZManVector<TPZInterpolatedElement_*,_10>::~TPZManVector
                (&fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>);
      return;
    }
    pTVar6 = TPZGeoMesh::Element(pTVar2,*(int64_t *)(p_Var11 + 1));
    if ((*(_Base_ptr *)(p_Var11 + 1) != p_Var11[1]._M_left) && (pTVar6->fMatId == skeletonmatid))
    break;
    p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
  }
  if ((pTVar6->fReference != (TPZCompEl *)0x0) &&
     (pTVar6->fReference ==
      (TPZCompEl *)
      *fluxorig.super_TPZManVector<TPZInterpolatedElement_*,_10>.
       super_TPZVec<TPZInterpolatedElement_*>.fStore)) {
    gelside.fGeoEl = (TPZGeoEl *)((ulong)gelside.fGeoEl & 0xffffffff00000000);
    gelside.fSide = 0;
    gelside._20_4_ = 0;
    TPZMHMeshControl::ConnectedElements
              (&this->super_TPZMHMeshControl,(int64_t)*(_Base_ptr *)(p_Var11 + 1),
               (pair<long,_long> *)&p_Var11[1]._M_parent,
               (map<long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::list<TPZCompElSide,_std::allocator<TPZCompElSide>_>_>_>_>
                *)&gelside);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
               ,0x389);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
             ,899);
}

Assistant:

void TPZMHMixedMeshControl::HybridizeSkeleton(int skeletonmatid, int pressurematid)
{

    fGMesh->ResetReference();
    int64_t nskel = fInterfaces.size();
    std::map<int64_t, std::pair<int64_t, int64_t> >::iterator it;
    TPZStack<TPZInterpolatedElement*> fluxorig;
    TPZStack<TPZInterpolatedElement *> fluxsecond;
    TPZStack<TPZInterpolatedElement *> pressure;

    fFluxMesh->LoadReferences();
    // build the fluxorig datastructure : contains the original flux elements
    // loop over the skeleton elements
    for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        TPZGeoEl *gel = fGMesh->Element(it->first);
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        if (gel->MaterialId() != skeletonmatid) {
            continue;
        }
        int side = gel->NSides()-1;
        TPZInterpolatedElement *orig = dynamic_cast<TPZInterpolatedElement *>(gel->Reference());
        fluxorig.Push(orig);
    }
    fGMesh->ResetReference();
    
    fPressureFineMesh->SetDefaultOrder(fpOrderSkeleton);
    // first create a second flux element and a pressure element on top of the existing skeleton element
    // loop over the skeleton elements
    for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        TPZGeoEl *gel = fGMesh->Element(it->first);
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        if (gel->MaterialId() != skeletonmatid) {
            continue;
        }
        int side = gel->NSides()-1;
        TPZGeoElSide gelside(gel,side);
        TPZGeoElBC skeleton2(gelside,fSecondSkeletonMatId);
        fFluxMesh->SetAllCreateFunctionsHDiv();
        // create a flux boundary element
        TPZCompEl* celflux = fFluxMesh->CreateCompEl(skeleton2.CreatedElement());
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(celflux);
        SetSubdomain(intel, -1);
#ifdef PZDEBUG
        if (intel->NConnects() != 1) {
            DebugStop();
        }
#endif
        // the side orientation of the boundary fluxes is +1 - we will need to fix the elements as well!
        if (it->second.first < it->second.second) {
            // totototo
            intel->SetSideOrient(side, 1);
        }
        else
        {
            intel->SetSideOrient(side, 1);
        }
        skeleton2.CreatedElement()->ResetReference();
        
        // create a dim-1 dimensional pressure element
        TPZGeoElBC pressuregel(gelside,pressurematid);
        // this will be changed to the pressure mesh
//        fFluxMesh->SetAllCreateFunctionsContinuous();
        fPressureFineMesh->SetAllCreateFunctionsContinuous();
//        fFluxMesh->CreateCompEl(pressuregel.CreatedElement(), indexpressure);
        TPZCompEl* celpressure = fPressureFineMesh->CreateCompEl(pressuregel.CreatedElement());
        TPZInterpolatedElement *presel = dynamic_cast<TPZInterpolatedElement *>(celpressure);
        SetSubdomain(presel, -1);
        // set the lagrange multiplier to the highest level
        int nc = presel->NConnects();
        for (int ic=0; ic<nc; ic++) {
            TPZConnect &c = presel->Connect(ic);
            c.SetLagrangeMultiplier(3);
        }
        // This can only be done after all flux connects have been created!!!
//        SetSubdomain(presel, -1);
        pressuregel.CreatedElement()->ResetReference();
        fluxsecond.Push(intel);
        pressure.Push(presel);
    }
    fFluxMesh->LoadReferences();
    
    // switch the connect dependency around AND fix the side orientation
    int64_t count = 0;
    for (it = fInterfaces.begin(); it != fInterfaces.end(); it++) {
        TPZGeoEl *gel = fGMesh->Element(it->first);
        // skip the boundary elements
        if (it->first == it->second.second) {
            continue;
        }
        if (gel->MaterialId() != skeletonmatid) {
            continue;
        }
        TPZCompEl *cel = gel->Reference();
        if (!cel || cel != fluxorig[count]) {
            DebugStop();
        }
        std::map<int64_t,std::list<TPZCompElSide> > connectedmap;
        // connected elements will compute all the subelements of the skeleton element to left and right
        ConnectedElements(it->first, it->second, connectedmap);
        if (connectedmap.size() != 2) {
            DebugStop();
        }
        // identify the domains left and right of the skeleton element
        int64_t origdepindex = fluxorig[count]->ConnectIndex(0);
        int64_t newdepindex = fluxsecond[count]->ConnectIndex(0);
        std::list<TPZCompElSide> &updatelist = connectedmap[it->second.second];
        for (std::list<TPZCompElSide>::iterator itlist = updatelist.begin(); itlist != updatelist.end(); itlist++)
        {
            TPZCompElSide smallCompElSide = *itlist;
            TPZInterpolatedElement *smallel = dynamic_cast<TPZInterpolatedElement *>(smallCompElSide.Element());
            if (smallel->NSideConnects(smallCompElSide.Side()) != 1) {
                DebugStop();
            }
            TPZConnect &c = smallel->SideConnect(0, smallCompElSide.Side());
            TPZConnect::TPZDepend *dep = c.FirstDepend();
            if(dep->fDepConnectIndex != origdepindex)
            {
                DebugStop();
            }
            dep->fDepConnectIndex = newdepindex;
            // Set the side orientation to +1
            smallel->SetSideOrient(smallCompElSide.Side(), 1);
        }
        SetSubdomain(fluxorig[count],it->second.first);
        SetSubdomain(fluxsecond[count], it->second.second);
        count++;
    }
    fGMesh->ResetReference();
    // switch the reference index of the original flux element and the pressure element
    int64_t numflux = fluxorig.size();
    for (int iflux=0; iflux<numflux; iflux++) {
        int64_t fluxgelindex = fluxorig[iflux]->Reference()->Index();
        int fluxmat = fluxorig[iflux]->Reference()->MaterialId();
        int pressmat = pressure[iflux]->Reference()->MaterialId();
        int64_t pressuregelindex = pressure[iflux]->Reference()->Index();
        fluxorig[iflux]->SetReference(pressuregelindex);
        pressure[iflux]->SetReference(fluxgelindex);
        SetAllMatid(fluxorig[iflux]->Reference(), fluxmat);
        SetAllMatid(pressure[iflux]->Reference(), pressmat);
    }

    // The connects of the pressure mesh are not to be condensed
    fFluxMesh->ExpandSolution();
    fPressureFineMesh->ExpandSolution();

}